

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

string * __thiscall
Assimp::XFileParser::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,XFileParser *this)

{
  char *pcVar1;
  unsigned_short uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  allocator<char> local_be;
  allocator<char> local_bd;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  allocator<char> local_b8;
  allocator<char> local_b7;
  allocator<char> local_b6;
  allocator<char> local_b5;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  allocator<char> local_b0;
  allocator<char> local_af;
  allocator<char> local_ae;
  allocator<char> local_ad;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  allocator<char> local_a8;
  allocator<char> local_a7;
  allocator<char> local_a6;
  allocator<char> local_a5;
  allocator<char> local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  uint local_58;
  int local_54;
  int iLen;
  int bounds;
  uint len;
  uint local_40;
  undefined4 local_3c;
  uint tok;
  string s;
  XFileParser *this_local;
  
  s.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&tok);
  if ((this->mIsBinaryFormat & 1U) == 0) {
    FindNextNoneWhiteSpace(this);
    if (this->mEnd <= this->mP) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
      goto LAB_009fb33e;
    }
    while( true ) {
      bVar6 = false;
      if (this->mP < this->mEnd) {
        iVar3 = isspace((uint)(byte)*this->mP);
        bVar6 = iVar3 == 0;
      }
      if (!bVar6) goto LAB_009fb327;
      if ((((*this->mP == ';') || (*this->mP == '}')) || (*this->mP == '{')) || (*this->mP == ','))
      break;
      pcVar1 = this->mP;
      this->mP = pcVar1 + 1;
      std::__cxx11::string::append((char *)&tok,(ulong)pcVar1);
    }
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 0) {
      pcVar1 = this->mP;
      this->mP = pcVar1 + 1;
      std::__cxx11::string::append((char *)&tok,(ulong)pcVar1);
    }
LAB_009fb327:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
  }
  else {
    if ((long)this->mEnd - (long)this->mP < 2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
      goto LAB_009fb33e;
    }
    uVar2 = ReadBinWord(this);
    local_40 = (uint)uVar2;
    switch(local_40) {
    case 1:
      if ((long)this->mEnd - (long)this->mP < 4) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
      }
      else {
        local_58 = ReadBinDWord(this);
        local_54 = (int)this->mEnd - (int)this->mP;
        iLen = local_58;
        if ((int)local_58 < 0) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
        }
        else if (local_54 < (int)local_58) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
        }
        else {
          pcVar1 = this->mP;
          uVar4 = (ulong)local_58;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_78,pcVar1,uVar4,&local_79);
          std::__cxx11::string::operator=((string *)&tok,local_78);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
          this->mP = this->mP + (uint)iLen;
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
        }
      }
      break;
    case 2:
      if ((long)this->mEnd - (long)this->mP < 4) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
      }
      else {
        iLen = ReadBinDWord(this);
        if ((long)this->mEnd - (long)this->mP < (long)iLen) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
        }
        else {
          pcVar1 = this->mP;
          uVar4 = (ulong)(uint)iLen;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a0,pcVar1,uVar4,&local_a1);
          std::__cxx11::string::operator=((string *)&tok,local_a0);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          this->mP = this->mP + (iLen + 2);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
        }
      }
      break;
    case 3:
      this->mP = this->mP + 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"<integer>",&local_a2);
      std::allocator<char>::~allocator(&local_a2);
      break;
    default:
      goto LAB_009fb327;
    case 5:
      this->mP = this->mP + 0x10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"<guid>",&local_a3);
      std::allocator<char>::~allocator(&local_a3);
      break;
    case 6:
      if ((long)this->mEnd - (long)this->mP < 4) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
      }
      else {
        iLen = ReadBinDWord(this);
        this->mP = this->mP + (uint)(iLen << 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"<int_list>",&local_a4);
        std::allocator<char>::~allocator(&local_a4);
      }
      break;
    case 7:
      if ((long)this->mEnd - (long)this->mP < 4) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok);
      }
      else {
        iLen = ReadBinDWord(this);
        this->mP = this->mP + iLen * this->mBinaryFloatSize;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"<flt_list>",&local_a5);
        std::allocator<char>::~allocator(&local_a5);
      }
      break;
    case 10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"{",&local_a6);
      std::allocator<char>::~allocator(&local_a6);
      break;
    case 0xb:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"}",&local_a7);
      std::allocator<char>::~allocator(&local_a7);
      break;
    case 0xc:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"(",&local_a8);
      std::allocator<char>::~allocator(&local_a8);
      break;
    case 0xd:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,")",&local_a9);
      std::allocator<char>::~allocator(&local_a9);
      break;
    case 0xe:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[",&local_aa);
      std::allocator<char>::~allocator(&local_aa);
      break;
    case 0xf:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"]",&local_ab);
      std::allocator<char>::~allocator(&local_ab);
      break;
    case 0x10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"<",&local_ac);
      std::allocator<char>::~allocator(&local_ac);
      break;
    case 0x11:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,">",&local_ad);
      std::allocator<char>::~allocator(&local_ad);
      break;
    case 0x12:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,".",&local_ae);
      std::allocator<char>::~allocator(&local_ae);
      break;
    case 0x13:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,",",&local_af);
      std::allocator<char>::~allocator(&local_af);
      break;
    case 0x14:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,";",&local_b0);
      std::allocator<char>::~allocator(&local_b0);
      break;
    case 0x1f:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"template",&local_b1);
      std::allocator<char>::~allocator(&local_b1);
      break;
    case 0x28:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"WORD",&local_b2);
      std::allocator<char>::~allocator(&local_b2);
      break;
    case 0x29:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"DWORD",&local_b3);
      std::allocator<char>::~allocator(&local_b3);
      break;
    case 0x2a:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"FLOAT",&local_b4);
      std::allocator<char>::~allocator(&local_b4);
      break;
    case 0x2b:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"DOUBLE",&local_b5);
      std::allocator<char>::~allocator(&local_b5);
      break;
    case 0x2c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"CHAR",&local_b6);
      std::allocator<char>::~allocator(&local_b6);
      break;
    case 0x2d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"UCHAR",&local_b7);
      std::allocator<char>::~allocator(&local_b7);
      break;
    case 0x2e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"SWORD",&local_b8);
      std::allocator<char>::~allocator(&local_b8);
      break;
    case 0x2f:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"SDWORD",&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      break;
    case 0x30:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"void",&local_ba);
      std::allocator<char>::~allocator(&local_ba);
      break;
    case 0x31:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"string",&local_bb);
      std::allocator<char>::~allocator(&local_bb);
      break;
    case 0x32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"unicode",&local_bc);
      std::allocator<char>::~allocator(&local_bc);
      break;
    case 0x33:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"cstring",&local_bd);
      std::allocator<char>::~allocator(&local_bd);
      break;
    case 0x34:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"array",&local_be);
      std::allocator<char>::~allocator(&local_be);
    }
  }
LAB_009fb33e:
  local_3c = 1;
  std::__cxx11::string::~string((string *)&tok);
  return __return_storage_ptr__;
}

Assistant:

std::string XFileParser::GetNextToken() {
    std::string s;

    // process binary-formatted file
    if( mIsBinaryFormat) {
        // in binary mode it will only return NAME and STRING token
        // and (correctly) skip over other tokens.
        if ( mEnd - mP < 2 ) {
            return s;
        }
        unsigned int tok = ReadBinWord();
        unsigned int len;

        // standalone tokens
        switch( tok ) {
            case 1: {
                // name token
                if ( mEnd - mP < 4 ) {
                    return s;
                }
                len = ReadBinDWord();
                const int bounds = int( mEnd - mP );
                const int iLen   = int( len );
                if ( iLen < 0 ) {
                    return s;
                }
                if ( bounds < iLen ) {
                    return s;
                }
                s = std::string( mP, len );
                mP += len;
            }
            return s;

            case 2:
                // string token
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                if( mEnd - mP < int(len)) return s;
                s = std::string(mP, len);
                mP += (len + 2);
                return s;
            case 3:
                // integer token
                mP += 4;
                return "<integer>";
            case 5:
                // GUID token
                mP += 16;
                return "<guid>";
            case 6:
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                mP += (len * 4);
                return "<int_list>";
            case 7:
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                mP += (len * mBinaryFloatSize);
                return "<flt_list>";
            case 0x0a:
                return "{";
            case 0x0b:
                return "}";
            case 0x0c:
                return "(";
            case 0x0d:
                return ")";
            case 0x0e:
                return "[";
            case 0x0f:
                return "]";
            case 0x10:
                return "<";
            case 0x11:
                return ">";
            case 0x12:
                return ".";
            case 0x13:
                return ",";
            case 0x14:
                return ";";
            case 0x1f:
                return "template";
            case 0x28:
                return "WORD";
            case 0x29:
                return "DWORD";
            case 0x2a:
                return "FLOAT";
            case 0x2b:
                return "DOUBLE";
            case 0x2c:
                return "CHAR";
            case 0x2d:
                return "UCHAR";
            case 0x2e:
                return "SWORD";
            case 0x2f:
                return "SDWORD";
            case 0x30:
                return "void";
            case 0x31:
                return "string";
            case 0x32:
                return "unicode";
            case 0x33:
                return "cstring";
            case 0x34:
                return "array";
        }
    }
    // process text-formatted file
    else
    {
        FindNextNoneWhiteSpace();
        if( mP >= mEnd)
            return s;

        while( (mP < mEnd) && !isspace( (unsigned char) *mP))
        {
            // either keep token delimiters when already holding a token, or return if first valid char
            if( *mP == ';' || *mP == '}' || *mP == '{' || *mP == ',')
            {
                if( !s.size())
                    s.append( mP++, 1);
                break; // stop for delimiter
            }
            s.append( mP++, 1);
        }
    }
    return s;
}